

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O0

void __thiscall
ConditionalJoin::cutDownMultiequals(ConditionalJoin *this,BlockBasic *exit,int4 in1,int4 in2)

{
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  reference ppPVar4;
  mapped_type *ppVVar5;
  MergePair local_88;
  Varnode *local_78;
  Varnode *subvn;
  Varnode *vn2;
  Varnode *vn1;
  PcodeOp *op;
  _List_const_iterator<PcodeOp_*> local_50;
  iterator local_48;
  _List_const_iterator<PcodeOp_*> local_40;
  int4 local_38;
  int4 local_34;
  int4 hi;
  int4 lo;
  const_iterator enditer;
  const_iterator iter;
  int4 in2_local;
  int4 in1_local;
  BlockBasic *exit_local;
  ConditionalJoin *this_local;
  
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&enditer);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator((_List_const_iterator<PcodeOp_*> *)&hi)
  ;
  local_38 = in2;
  local_34 = in1;
  if (in2 < in1) {
    local_38 = in1;
    local_34 = in2;
  }
  local_48._M_node = (_List_node_base *)BlockBasic::beginOp(exit);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_40,&local_48);
  enditer._M_node = local_40._M_node;
  op = (PcodeOp *)BlockBasic::endOp(exit);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_50,(iterator *)&op);
  _hi = local_50._M_node;
  do {
    while( true ) {
      bVar1 = std::operator!=(&enditer,(_Self *)&hi);
      if (!bVar1) {
        return;
      }
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&enditer);
      vn1 = (Varnode *)*ppPVar4;
      std::_List_const_iterator<PcodeOp_*>::operator++(&enditer);
      OVar2 = PcodeOp::code((PcodeOp *)vn1);
      if (OVar2 != CPUI_MULTIEQUAL) break;
      vn2 = PcodeOp::getIn((PcodeOp *)vn1,in1);
      subvn = PcodeOp::getIn((PcodeOp *)vn1,in2);
      if (vn2 == subvn) {
        Funcdata::opRemoveInput(this->data,(PcodeOp *)vn1,local_38);
      }
      else {
        MergePair::MergePair(&local_88,vn2,subvn);
        ppVVar5 = std::
                  map<ConditionalJoin::MergePair,_Varnode_*,_std::less<ConditionalJoin::MergePair>,_std::allocator<std::pair<const_ConditionalJoin::MergePair,_Varnode_*>_>_>
                  ::operator[](&this->mergeneed,&local_88);
        local_78 = *ppVVar5;
        Funcdata::opRemoveInput(this->data,(PcodeOp *)vn1,local_38);
        Funcdata::opSetInput(this->data,(PcodeOp *)vn1,local_78,local_34);
      }
      iVar3 = PcodeOp::numInput((PcodeOp *)vn1);
      if (iVar3 == 1) {
        Funcdata::opUninsert(this->data,(PcodeOp *)vn1);
        Funcdata::opSetOpcode(this->data,(PcodeOp *)vn1,CPUI_COPY);
        Funcdata::opInsertBegin(this->data,(PcodeOp *)vn1,exit);
      }
    }
    OVar2 = PcodeOp::code((PcodeOp *)vn1);
  } while (OVar2 == CPUI_COPY);
  return;
}

Assistant:

void ConditionalJoin::cutDownMultiequals(BlockBasic *exit,int4 in1,int4 in2)

{
  list<PcodeOp *>::const_iterator iter,enditer;

  int4 lo,hi;
  if (in1 > in2) {
    hi = in1;
    lo = in2;
  }
  else {
    hi = in2;
    lo = in1;
  }
  iter = exit->beginOp();
  enditer = exit->endOp();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;			// Advance iterator before inserts happen
    if (op->code() == CPUI_MULTIEQUAL) {
      Varnode *vn1 = op->getIn(in1);
      Varnode *vn2 = op->getIn(in2);
      if (vn1 == vn2) {
	data.opRemoveInput(op,hi);
      }
      else {
	Varnode *subvn = mergeneed[ MergePair(vn1,vn2) ];
	data.opRemoveInput(op,hi);
	data.opSetInput(op,subvn,lo);
      }
      if (op->numInput() == 1) {
	data.opUninsert(op);
	data.opSetOpcode(op,CPUI_COPY);
	data.opInsertBegin(op,exit);
      }
    }
    else if (op->code() != CPUI_COPY) break;
  }
}